

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix::
TabulatedBackgroundRMatrix
          (TabulatedBackgroundRMatrix *this,int index,
          vector<long,_std::allocator<long>_> *boundaries,
          vector<long,_std::allocator<long>_> *interpolants,
          vector<double,_std::allocator<double>_> *energies,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *rmatrix)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *values;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::
  extractReal<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
            (&local_60,(TabulatedBackgroundRMatrix *)rmatrix,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)boundaries);
  Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::
  extractImaginary<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
            (&local_48,(TabulatedBackgroundRMatrix *)rmatrix,values);
  TabulatedBackgroundRMatrix(this,index,boundaries,interpolants,energies,&local_60,&local_48);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TabulatedBackgroundRMatrix( int index,
                            std::vector< long >&& boundaries,
                            std::vector< long >&& interpolants,
                            std::vector< double >&& energies,
                            std::vector< std::complex< double > >&& rmatrix ) :
  TabulatedBackgroundRMatrix( index,
                              std::move( boundaries ),
                              std::move( interpolants ),
                              std::move( energies ),
                              extractReal( rmatrix ),
                              extractImaginary( rmatrix ) ) {}